

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O0

void __thiscall Parse::TPTP::addTagState(TPTP *this,Tag t)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  State elem;
  undefined4 in_stack_fffffffffffffff0;
  
  elem = (State)((ulong)in_RDI >> 0x20);
  Lib::Stack<Parse::TPTP::State>::push
            ((Stack<Parse::TPTP::State> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),elem);
  Lib::Stack<Parse::TPTP::Tag>::push
            ((Stack<Parse::TPTP::Tag> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),elem);
  return;
}

Assistant:

void TPTP::addTagState(Tag t)
{
  _states.push(TAG);
  _tags.push(t);
}